

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSet<google::protobuf::Message>
          (ExtensionSet *this,char *ptr,Message *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  long v1;
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [12];
  bool bVar4;
  byte *pbVar5;
  Nonnull<const_char_*> pcVar6;
  uint32_t uVar7;
  uint uVar8;
  byte *unaff_R12;
  int iVar9;
  long v1_00;
  int iVar10;
  pair<const_char_*,_unsigned_int> pVar11;
  byte *local_60;
  ExtensionSet *local_58;
  Message *local_50;
  InternalMetadata *local_48;
  
  local_60 = (byte *)ptr;
  local_58 = this;
  local_50 = extendee;
  local_48 = metadata;
  do {
    bVar4 = EpsCopyInputStream::DoneWithCheck<false>
                      (&ctx->super_EpsCopyInputStream,(char **)&local_60,ctx->group_depth_);
    if (bVar4) {
      return (char *)local_60;
    }
    bVar1 = *local_60;
    auVar3[8] = bVar1;
    auVar3._0_8_ = local_60 + 1;
    auVar3._9_3_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_60[1];
      uVar7 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar11 = ReadTagFallback((char *)local_60,uVar7);
        auVar3 = pVar11._0_12_;
      }
      else {
        auVar3._8_4_ = uVar7;
        auVar3._0_8_ = local_60 + 2;
      }
    }
    local_60 = auVar3._0_8_;
    if (local_60 == (byte *)0x0) {
LAB_002bb78e:
      unaff_R12 = (byte *)0x0;
LAB_002bb790:
      bVar4 = false;
    }
    else {
      uVar8 = auVar3._8_4_;
      if (uVar8 == 0) {
LAB_002bb761:
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar8 - 1;
        unaff_R12 = local_60;
        goto LAB_002bb790;
      }
      if (uVar8 == 0xb) {
        iVar9 = ctx->depth_;
        v1 = (long)iVar9 + -1;
        iVar10 = (int)v1;
        ctx->depth_ = iVar10;
        if ((long)iVar9 < 1) {
          local_60 = (byte *)0x0;
        }
        else {
          v1_00 = (long)ctx->group_depth_ + 1;
          iVar9 = (int)v1_00;
          ctx->group_depth_ = iVar9;
          pbVar5 = (byte *)ParseMessageSetItem(local_58,(char *)local_60,local_50,local_48,ctx);
          if (pbVar5 != (byte *)0x0) {
            if (iVar10 == ctx->depth_) {
              pcVar6 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (v1,(long)ctx->depth_,"old_depth == depth_");
            }
            if (pcVar6 != (Nonnull<const_char_*>)0x0) {
              ParseMessageSet<google::protobuf::Message>();
LAB_002bb7f9:
              ParseMessageSet<google::protobuf::Message>();
            }
            if (iVar9 == ctx->group_depth_) {
              pcVar6 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (v1_00,(long)ctx->group_depth_,"old_group_depth == group_depth_");
            }
            if (pcVar6 != (Nonnull<const_char_*>)0x0) goto LAB_002bb7f9;
          }
          ctx->group_depth_ = ctx->group_depth_ + -1;
          ctx->depth_ = ctx->depth_ + 1;
          uVar7 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          local_60 = pbVar5;
          if (uVar7 != 0xb) {
            local_60 = (byte *)0x0;
          }
        }
      }
      else {
        if ((uVar8 & 7) == 4) goto LAB_002bb761;
        local_60 = (byte *)ParseField(local_58,(ulong)uVar8,(char *)local_60,local_50,local_48,ctx);
      }
      if (local_60 == (byte *)0x0) goto LAB_002bb78e;
      bVar4 = true;
    }
    if (!bVar4) {
      return (char *)unaff_R12;
    }
  } while( true );
}

Assistant:

const char* ParseMessageSet(const char* ptr, const Msg* extendee,
                              InternalMetadata* metadata,
                              internal::ParseContext* ctx) {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      if (tag == WireFormatLite::kMessageSetItemStartTag) {
        ptr = ctx->ParseGroupInlined(ptr, tag, [&](const char* ptr) {
          return ParseMessageSetItem(ptr, extendee, metadata, ctx);
        });
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      } else {
        if (tag == 0 || (tag & 7) == 4) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        ptr = ParseField(tag, ptr, extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    }
    return ptr;
  }